

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O3

apriltag_detector_t * apriltag_detector_create(void)

{
  apriltag_detector_t *paVar1;
  zarray_t *pzVar2;
  timeprofile_t *ptVar3;
  int64_t iVar4;
  
  paVar1 = (apriltag_detector_t *)calloc(1,0x88);
  paVar1->nthreads = 1;
  paVar1->quad_decimate = 2.0;
  (paVar1->qtp).min_cluster_pixels = 5;
  (paVar1->qtp).max_nmaxima = 10;
  (paVar1->qtp).cos_critical_rad = 0.9848077;
  (paVar1->qtp).max_line_fit_mse = 10.0;
  (paVar1->qtp).min_white_black_diff = 5;
  pzVar2 = (zarray_t *)calloc(1,0x18);
  pzVar2->el_sz = 8;
  paVar1->tag_families = pzVar2;
  pthread_mutex_init((pthread_mutex_t *)&paVar1->mutex,(pthread_mutexattr_t *)0x0);
  ptVar3 = (timeprofile_t *)calloc(1,0x10);
  pzVar2 = (zarray_t *)calloc(1,0x18);
  pzVar2->el_sz = 0x28;
  ptVar3->stamps = pzVar2;
  iVar4 = utime_now();
  ptVar3->utime = iVar4;
  paVar1->tp = ptVar3;
  paVar1->refine_edges = 1;
  paVar1->decode_sharpening = 0.25;
  paVar1->debug = 0;
  return paVar1;
}

Assistant:

apriltag_detector_t *apriltag_detector_create()
{
    apriltag_detector_t *td = (apriltag_detector_t*) calloc(1, sizeof(apriltag_detector_t));

    td->nthreads = 1;
    td->quad_decimate = 2.0;
    td->quad_sigma = 0.0;

    td->qtp.max_nmaxima = 10;
    td->qtp.min_cluster_pixels = 5;

    td->qtp.max_line_fit_mse = 10.0;
    td->qtp.cos_critical_rad = cos(10 * M_PI / 180);
    td->qtp.deglitch = 0;
    td->qtp.min_white_black_diff = 5;

    td->tag_families = zarray_create(sizeof(apriltag_family_t*));

    pthread_mutex_init(&td->mutex, NULL);

    td->tp = timeprofile_create();

    td->refine_edges = 1;
    td->decode_sharpening = 0.25;


    td->debug = 0;

    // NB: defer initialization of td->wp so that the user can
    // override td->nthreads.

    return td;
}